

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall helics::apps::Player::sendInformation(Player *this,Time sendTime,int iteration)

{
  pointer pVVar1;
  size_t sVar2;
  _Elt_pointer pPVar3;
  _Elt_pointer pEVar4;
  ulong uVar5;
  _Map_pointer __n;
  undefined4 in_register_00000014;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  pointer pMVar6;
  Publication *pPVar7;
  Endpoint *this_00;
  ulong in_R8;
  
  __buf = (void *)CONCAT44(in_register_00000014,iteration);
  if (this->pointIndex <
      (ulong)((long)(this->points).
                    super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->points).
                    super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 7)) {
    do {
      pVVar1 = (this->points).
               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar2 = this->pointIndex;
      if (sendTime.internalTimeCode <= pVVar1[sVar2].time.internalTimeCode) break;
      pPVar3 = (this->publications).
               super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      uVar5 = ((long)pPVar3 -
               (long)(this->publications).
                     super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x70a3d70a3d70a3d7 +
              (long)pVVar1[sVar2].index;
      if (uVar5 < 2) {
        pPVar7 = pPVar3 + pVVar1[sVar2].index;
      }
      else {
        in_R8 = uVar5 >> 1;
        pPVar7 = (this->publications).
                 super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node[in_R8] + uVar5 + in_R8 * -2;
      }
      Publication::publishDefV(pPVar7,&pVVar1[sVar2].value);
      pVVar1 = (this->points).
               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar5 = this->pointIndex + 1;
      this->pointIndex = uVar5;
      __buf = extraout_RDX;
    } while (uVar5 < (ulong)((long)pVVar1 -
                             (long)(this->points).
                                   super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7));
    if (this->pointIndex <
        (ulong)((long)(this->points).
                      super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->points).
                      super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 7)) {
      do {
        pVVar1 = (this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar2 = this->pointIndex;
        if ((pVVar1[sVar2].time.internalTimeCode != sendTime.internalTimeCode) ||
           (pVVar1[sVar2].iteration != iteration)) break;
        pPVar3 = (this->publications).
                 super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar5 = ((long)pPVar3 -
                 (long)(this->publications).
                       super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x70a3d70a3d70a3d7
                + (long)pVVar1[sVar2].index;
        if (uVar5 < 2) {
          pPVar7 = pPVar3 + pVVar1[sVar2].index;
        }
        else {
          in_R8 = uVar5 >> 1;
          pPVar7 = (this->publications).
                   super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_node[in_R8] + uVar5 + in_R8 * -2;
        }
        Publication::publishDefV(pPVar7,&pVVar1[sVar2].value);
        pVVar1 = (this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar5 = this->pointIndex + 1;
        this->pointIndex = uVar5;
        __buf = extraout_RDX_00;
      } while (uVar5 < (ulong)((long)pVVar1 -
                               (long)(this->points).
                                     super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 7));
    }
  }
  uVar5 = ((long)(this->messages).
                 super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->messages).
                 super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f;
  if (this->messageIndex <= uVar5 && uVar5 - this->messageIndex != 0) {
    do {
      pMVar6 = (this->messages).
               super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sendTime.internalTimeCode < pMVar6[this->messageIndex].sendTime.internalTimeCode) {
        return;
      }
      pMVar6 = pMVar6 + this->messageIndex;
      __n = (_Map_pointer)(long)pMVar6->index;
      pEVar4 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      uVar5 = ((long)pEVar4 -
               (long)(this->endpoints).
                     super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 3) * -0x1111111111111111 +
              (long)__n;
      if (uVar5 < 4) {
        this_00 = pEVar4 + (long)__n;
      }
      else {
        __n = (this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
        in_R8 = (uVar5 >> 2) + 0xc000000000000000;
        if (0 < (long)uVar5) {
          in_R8 = uVar5 >> 2;
        }
        __buf = (void *)(in_R8 * 4);
        this_00 = __n[in_R8] + uVar5 + in_R8 * -4;
      }
      Endpoint::send(this_00,(int)pMVar6 + 0x10,__buf,(size_t)__n,(int)in_R8);
      pMVar6 = (this->messages).
               super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar5 = this->messageIndex + 1;
      this->messageIndex = uVar5;
      __buf = extraout_RDX_01;
    } while (uVar5 < (ulong)(((long)pMVar6 -
                              (long)(this->messages).
                                    super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0xf0f0f0f0f0f0f0f));
  }
  return;
}

Assistant:

void Player::sendInformation(Time sendTime, int iteration)
{
    if (isValidIndex(pointIndex, points)) {
        while (points[pointIndex].time < sendTime) {
            publications[points[pointIndex].index].publish(points[pointIndex].value);
            ++pointIndex;
            if (pointIndex >= points.size()) {
                break;
            }
        }
        if (isValidIndex(pointIndex, points)) {
            while ((points[pointIndex].time == sendTime) &&
                   (points[pointIndex].iteration == iteration)) {
                publications[points[pointIndex].index].publish(points[pointIndex].value);
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
    }
    if (isValidIndex(messageIndex, messages)) {
        while (messages[messageIndex].sendTime <= sendTime) {
            endpoints[messages[messageIndex].index].send(messages[messageIndex].mess);
            ++messageIndex;
            if (messageIndex >= messages.size()) {
                break;
            }
        }
    }
}